

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_encode_cblks(opj_t1_t *t1,opj_tcd_tile_t *tile,opj_tcp_t *tcp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  opj_bool oVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  long in_RDX;
  opj_tcd_tile_t *unaff_RBX;
  long in_RSI;
  long in_RDI;
  double dVar14;
  int tmp_1;
  int tmp;
  opj_tcd_resolution_t *pres_1;
  opj_tcd_resolution_t *pres;
  int y;
  int x;
  int j;
  int i;
  int cblk_h;
  int cblk_w;
  int *tiledp;
  int *datap;
  opj_tcd_cblk_enc_t *cblk;
  opj_tcd_precinct_t *prc;
  int bandconst;
  opj_tcd_band_t *band;
  opj_tcd_resolution_t *res;
  int tile_w;
  opj_tccp_t *tccp;
  opj_tcd_tilecomp_t *tilec;
  int cblkno;
  int precno;
  int bandno;
  int resno;
  int compno;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar15;
  int iVar16;
  int iVar17;
  int local_28;
  int local_24;
  
  *(undefined8 *)(in_RSI + 0x28) = 0;
  local_24 = 0;
  do {
    if (*(int *)(in_RSI + 0x10) <= local_24) {
      return;
    }
    piVar6 = (int *)(*(long *)(in_RSI + 0x18) + (long)local_24 * 0x30);
    lVar7 = *(long *)(in_RDX + 0x15e0) + (long)local_24 * 0x438;
    iVar3 = piVar6[2] - *piVar6;
    for (local_28 = 0; local_28 < piVar6[4]; local_28 = local_28 + 1) {
      lVar8 = *(long *)(piVar6 + 6) + (long)local_28 * 0x98;
      for (iVar17 = 0; iVar17 < *(int *)(lVar8 + 0x18); iVar17 = iVar17 + 1) {
        piVar9 = (int *)(lVar8 + 0x20 + (long)iVar17 * 0x28);
        dVar14 = floor((double)((float)piVar9[9] * 8192.0));
        for (iVar16 = 0; iVar16 < *(int *)(lVar8 + 0x10) * *(int *)(lVar8 + 0x14);
            iVar16 = iVar16 + 1) {
          lVar10 = *(long *)(piVar9 + 6) + (long)iVar16 * 0x30;
          for (iVar15 = 0; iVar15 < *(int *)(lVar10 + 0x10) * *(int *)(lVar10 + 0x14);
              iVar15 = iVar15 + 1) {
            lVar11 = *(long *)(lVar10 + 0x18) + (long)iVar15 * 0x40;
            local_9c = *(int *)(lVar11 + 0x18) - *piVar9;
            local_a0 = *(int *)(lVar11 + 0x1c) - piVar9[1];
            if ((piVar9[4] & 1U) != 0) {
              piVar12 = (int *)(*(long *)(piVar6 + 6) + (long)(local_28 + -1) * 0x98);
              local_9c = (piVar12[2] - *piVar12) + local_9c;
            }
            if ((piVar9[4] & 2U) != 0) {
              lVar11 = *(long *)(piVar6 + 6) + (long)(local_28 + -1) * 0x98;
              local_a0 = (*(int *)(lVar11 + 0xc) - *(int *)(lVar11 + 4)) + local_a0;
            }
            oVar4 = allocate_buffers((opj_t1_t *)
                                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                     in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
            if (oVar4 == 0) {
              return;
            }
            lVar11 = *(long *)(in_RDI + 0x18);
            iVar1 = *(int *)(in_RDI + 0x28);
            iVar2 = *(int *)(in_RDI + 0x2c);
            lVar13 = *(long *)(piVar6 + 8) + (long)(local_a0 * iVar3 + local_9c) * 4;
            if (*(int *)(lVar7 + 0x14) == 1) {
              for (local_98 = 0; local_98 < iVar2; local_98 = local_98 + 1) {
                for (local_94 = 0; local_94 < iVar1; local_94 = local_94 + 1) {
                  *(int *)(lVar11 + (long)(local_98 * iVar1 + local_94) * 4) =
                       *(int *)(lVar13 + (long)(local_98 * iVar3 + local_94) * 4) << 6;
                }
              }
            }
            else {
              for (local_98 = 0; local_98 < iVar2; local_98 = local_98 + 1) {
                for (local_94 = 0; local_94 < iVar1; local_94 = local_94 + 1) {
                  iVar5 = fix_mul(*(int *)(lVar13 + (long)(local_98 * iVar3 + local_94) * 4),
                                  (int)(0x4000000 / (long)(int)dVar14));
                  *(int *)(lVar11 + (long)(local_98 * iVar1 + local_94) * 4) = iVar5 >> 5;
                }
              }
            }
            in_stack_ffffffffffffff30 = *(int *)(in_RSI + 0x10);
            in_stack_ffffffffffffff38 = *(undefined4 *)(in_RDX + 0x10);
            t1_encode_cblk((opj_t1_t *)CONCAT44(iVar17,iVar16),
                           (opj_tcd_cblk_enc_t *)CONCAT44(iVar15,in_stack_ffffffffffffffc8),
                           (int)((ulong)piVar6 >> 0x20),(int)piVar6,(int)((ulong)lVar7 >> 0x20),
                           (int)lVar7,(double)CONCAT44(iVar3,in_stack_ffffffffffffffb0),(int)in_RDX,
                           (int)in_RSI,(int)in_RDI,unaff_RBX);
          }
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void t1_encode_cblks(
		opj_t1_t *t1,
		opj_tcd_tile_t *tile,
		opj_tcp_t *tcp)
{
	int compno, resno, bandno, precno, cblkno;

	tile->distotile = 0;		/* fixed_quality */

	for (compno = 0; compno < tile->numcomps; ++compno) {
		opj_tcd_tilecomp_t* tilec = &tile->comps[compno];
		opj_tccp_t* tccp = &tcp->tccps[compno];
		int tile_w = tilec->x1 - tilec->x0;

		for (resno = 0; resno < tilec->numresolutions; ++resno) {
			opj_tcd_resolution_t *res = &tilec->resolutions[resno];

			for (bandno = 0; bandno < res->numbands; ++bandno) {
				opj_tcd_band_t* restrict band = &res->bands[bandno];
        int bandconst = 8192 * 8192 / ((int) floor(band->stepsize * 8192));

				for (precno = 0; precno < res->pw * res->ph; ++precno) {
					opj_tcd_precinct_t *prc = &band->precincts[precno];

					for (cblkno = 0; cblkno < prc->cw * prc->ch; ++cblkno) {
						opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
						int* restrict datap;
						int* restrict tiledp;
						int cblk_w;
						int cblk_h;
						int i, j;

						int x = cblk->x0 - band->x0;
						int y = cblk->y0 - band->y0;
						if (band->bandno & 1) {
							opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
							x += pres->x1 - pres->x0;
						}
						if (band->bandno & 2) {
							opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
							y += pres->y1 - pres->y0;
						}

						if(!allocate_buffers(
									t1,
									cblk->x1 - cblk->x0,
									cblk->y1 - cblk->y0))
						{
							return;
						}

						datap=t1->data;
						cblk_w = t1->w;
						cblk_h = t1->h;

						tiledp=&tilec->data[(y * tile_w) + x];
						if (tccp->qmfbid == 1) {
							for (j = 0; j < cblk_h; ++j) {
								for (i = 0; i < cblk_w; ++i) {
									int tmp = tiledp[(j * tile_w) + i];
									datap[(j * cblk_w) + i] = tmp << T1_NMSEDEC_FRACBITS;
								}
							}
						} else {		/* if (tccp->qmfbid == 0) */
							for (j = 0; j < cblk_h; ++j) {
								for (i = 0; i < cblk_w; ++i) {
									int tmp = tiledp[(j * tile_w) + i];
									datap[(j * cblk_w) + i] =
										fix_mul(
										tmp,
										bandconst) >> (11 - T1_NMSEDEC_FRACBITS);
								}
							}
						}

						t1_encode_cblk(
								t1,
								cblk,
								band->bandno,
								compno,
								tilec->numresolutions - 1 - resno,
								tccp->qmfbid,
								band->stepsize,
								tccp->cblksty,
								tile->numcomps,
								tcp->mct,
								tile);

					} /* cblkno */
				} /* precno */
			} /* bandno */
		} /* resno  */
	} /* compno  */
}